

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void print_table_object(flatcc_json_printer_t *ctx,void *p,int ttl,flatcc_json_printer_table_f *pf)

{
  char *pcVar1;
  flatcc_json_printer_table_descriptor_t td;
  flatcc_json_printer_table_descriptor_t local_28;
  
  local_28.ttl = ttl + -1;
  if (local_28.ttl == 0) {
    if (ctx->error == 0) {
      ctx->error = 2;
    }
  }
  else {
    ctx->level = ctx->level + 1;
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '{';
    local_28.count = 0;
    local_28.vtable = (void *)((long)p - (long)*p);
    local_28.vsize = (int)*local_28.vtable;
    local_28.table = p;
    (*pf)(ctx,&local_28);
    if (ctx->indent != '\0') {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '}';
  }
  return;
}

Assistant:

static inline void print_table_object(flatcc_json_printer_t *ctx,
        const void *p, int ttl, flatcc_json_printer_table_f pf)
{
    flatcc_json_printer_table_descriptor_t td;

    if (!--ttl) {
        flatcc_json_printer_set_error(ctx, flatcc_json_printer_error_deep_recursion);
        return;
    }
    print_start('{');
    td.count = 0;
    td.ttl = ttl;
    td.table = p;
    td.vtable = (uint8_t *)p - __flatbuffers_soffset_read_from_pe(p);
    td.vsize = __flatbuffers_voffset_read_from_pe(td.vtable);
    pf(ctx, &td);
    print_end('}');
}